

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_node_struct *n,xpath_allocator *alloc)

{
  bool bVar1;
  xml_node_struct *in_RDX;
  xpath_node_set_raw *in_RSI;
  long in_RDI;
  xml_node_type type;
  xml_node *in_stack_fffffffffffffeb8;
  xpath_allocator *in_stack_fffffffffffffec0;
  xpath_node *in_stack_fffffffffffffec8;
  xpath_node_set_raw *in_stack_fffffffffffffed0;
  xml_node local_f0 [3];
  xml_node local_d8 [3];
  xml_node local_c0 [3];
  xml_node local_a8 [3];
  xml_node local_90 [3];
  xml_node local_78 [3];
  xml_node local_60 [3];
  xml_node local_48 [3];
  uint local_2c;
  xml_node_struct *local_20;
  xpath_node_set_raw *local_18;
  
  local_2c = (uint)in_RDX->header & 0xf;
  local_20 = in_RDX;
  local_18 = in_RSI;
  switch(*(undefined1 *)(in_RDI + 3)) {
  case 1:
    if (((local_2c == 2) && (in_RDX->name != (char_t *)0x0)) &&
       (bVar1 = strequal((char_t *)in_stack_fffffffffffffec0,(char_t *)in_stack_fffffffffffffeb8),
       bVar1)) {
      xml_node::xml_node(local_48,local_20);
      xpath_node::xpath_node((xpath_node *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      xpath_node_set_raw::push_back
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      return true;
    }
    break;
  case 2:
    xml_node::xml_node(local_60,in_RDX);
    xpath_node::xpath_node((xpath_node *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    xpath_node_set_raw::push_back
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    return true;
  case 3:
    if (local_2c == 5) {
      xml_node::xml_node(local_78,in_RDX);
      xpath_node::xpath_node((xpath_node *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      xpath_node_set_raw::push_back
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      return true;
    }
    break;
  case 4:
    if (local_2c == 6) {
      xml_node::xml_node(local_a8,in_RDX);
      xpath_node::xpath_node((xpath_node *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      xpath_node_set_raw::push_back
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      return true;
    }
    break;
  case 5:
    if ((local_2c == 3) || (local_2c == 4)) {
      xml_node::xml_node(local_90,in_RDX);
      xpath_node::xpath_node((xpath_node *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      xpath_node_set_raw::push_back
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      return true;
    }
    break;
  case 6:
    if (((local_2c == 6) && (in_RDX->name != (char_t *)0x0)) &&
       (bVar1 = strequal((char_t *)in_stack_fffffffffffffec0,(char_t *)in_stack_fffffffffffffeb8),
       bVar1)) {
      xml_node::xml_node(local_c0,local_20);
      xpath_node::xpath_node((xpath_node *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      xpath_node_set_raw::push_back(local_18,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      return true;
    }
    break;
  case 7:
    if (local_2c == 2) {
      xml_node::xml_node(local_d8,in_RDX);
      xpath_node::xpath_node((xpath_node *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      xpath_node_set_raw::push_back
                (in_stack_fffffffffffffed0,(xpath_node *)in_RSI,in_stack_fffffffffffffec0);
      return true;
    }
    break;
  case 8:
    if (((local_2c == 2) && (in_RDX->name != (char_t *)0x0)) &&
       (bVar1 = starts_with(in_RDX->name,*(char_t **)(in_RDI + 0x20)), bVar1)) {
      xml_node::xml_node(local_f0,local_20);
      xpath_node::xpath_node((xpath_node *)local_18,in_stack_fffffffffffffeb8);
      xpath_node_set_raw::push_back
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(xpath_allocator *)local_18);
      return true;
    }
  }
  return false;
}

Assistant:

bool step_push(xpath_node_set_raw& ns, xml_node_struct* n, xpath_allocator* alloc)
		{
			assert(n);

			xml_node_type type = PUGI__NODETYPE(n);

			switch (_test)
			{
			case nodetest_name:
				if (type == node_element && n->name && strequal(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_node:
				ns.push_back(xml_node(n), alloc);
				return true;

			case nodetest_type_comment:
				if (type == node_comment)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_text:
				if (type == node_pcdata || type == node_cdata)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_pi:
				if (type == node_pi)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_pi:
				if (type == node_pi && n->name && strequal(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_all:
				if (type == node_element)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_all_in_namespace:
				if (type == node_element && n->name && starts_with(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			default:
				assert(false && "Unknown axis"); // unreachable
			}

			return false;
		}